

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O3

void __thiscall ResourceManager::destroy(ResourceManager *this)

{
  Resource *pRVar1;
  ResourceManager *pRVar2;
  pointer ppRVar3;
  __normal_iterator<Resource_**,_std::vector<Resource_*,_std::allocator<Resource_*>_>_> __tmp;
  pointer ppRVar4;
  
  ppRVar3 = (this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar4 = (this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppRVar4 != ppRVar3) {
    do {
      pRVar1 = ppRVar4[-1];
      ppRVar4 = ppRVar4 + -1;
      (**pRVar1->_vptr_Resource)(pRVar1);
      (*pRVar1->_vptr_Resource[4])(pRVar1);
      ppRVar3 = (this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (ppRVar4 != ppRVar3);
    ppRVar4 = (this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (ppRVar4 != ppRVar3) {
    (this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar3;
  }
  pRVar2 = rm;
  if ((rm != (ResourceManager *)0x0) &&
     (ppRVar3 = (rm->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
                super__Vector_impl_data._M_start, ppRVar3 != (pointer)0x0)) {
    operator_delete(ppRVar3,(long)(rm->resources).
                                  super__Vector_base<Resource_*,_std::allocator<Resource_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppRVar3)
    ;
  }
  operator_delete(pRVar2,0x18);
  rm = (ResourceManager *)0x0;
  return;
}

Assistant:

void ResourceManager::destroy(void)
{
   std::vector<Resource*>::reverse_iterator it;
  
   for (it = resources.rbegin(); it != resources.rend(); it++) {
      Resource* r = *it;
      r->destroy();
      delete r;
   }

   resources.clear();

   delete rm;
   rm = 0;
}